

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O2

void __thiscall ELFIO::elfio::create_mandatory_sections(elfio *this)

{
  elf_header *peVar1;
  section *psVar2;
  allocator local_51;
  string local_50;
  string local_30 [32];
  
  psVar2 = create_section(this);
  (*psVar2->_vptr_section[0x1e])(psVar2,0);
  std::__cxx11::string::string(local_30,"",(allocator *)&local_50);
  (*psVar2->_vptr_section[4])(psVar2,local_30);
  std::__cxx11::string::~string(local_30);
  (*psVar2->_vptr_section[0x16])(psVar2,0);
  peVar1 = this->header;
  if (peVar1 != (elf_header *)0x0) {
    (*peVar1->_vptr_elf_header[0x21])(peVar1,1);
  }
  std::__cxx11::string::string((string *)&local_50,".shstrtab",&local_51);
  psVar2 = Sections::add(&this->sections,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  (*psVar2->_vptr_section[6])(psVar2,3);
  (*psVar2->_vptr_section[0xe])(psVar2,1);
  return;
}

Assistant:

void create_mandatory_sections()
    {
        // Create null section without calling to 'add_section' as no string
        // section containing section names exists yet
        section* sec0 = create_section();
        sec0->set_index( 0 );
        sec0->set_name( "" );
        sec0->set_name_string_offset( 0 );

        set_section_name_str_index( 1 );
        section* shstrtab = sections.add( ".shstrtab" );
        shstrtab->set_type( SHT_STRTAB );
        shstrtab->set_addr_align( 1 );
    }